

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O2

Vec_Int_t *
Iso_ManFindMapping(Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vPerm1_,Vec_Int_t *vPerm2_,
                  int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint nCapMin;
  Vec_Int_t *local_50;
  Vec_Int_t *vInvPerm2;
  
  if ((((pAig1->nObjs[2] == pAig2->nObjs[2]) && (pAig1->nObjs[3] == pAig2->nObjs[3])) &&
      (pAig1->nRegs == pAig2->nRegs)) &&
     (pAig1->nObjs[6] + pAig1->nObjs[5] == pAig2->nObjs[6] + pAig2->nObjs[5])) {
    iVar1 = Aig_ManLevelNum(pAig1);
    iVar2 = Aig_ManLevelNum(pAig2);
    if (iVar1 == iVar2) {
      if (fVerbose != 0) {
        puts("AIG1:");
      }
      local_50 = vPerm1_;
      if (vPerm1_ == (Vec_Int_t *)0x0) {
        local_50 = Saig_ManFindIsoPerm(pAig1,fVerbose);
      }
      if (fVerbose != 0) {
        puts("AIG1:");
      }
      p = vPerm2_;
      if (vPerm2_ == (Vec_Int_t *)0x0) {
        p = Saig_ManFindIsoPerm(pAig2,fVerbose);
      }
      if ((vPerm1_ != (Vec_Int_t *)0x0) && (vPerm1_->nSize != pAig1->nObjs[2])) {
        __assert_fail("Vec_IntSize(vPerm1_) == Aig_ManCiNum(pAig1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                      ,0x121,
                      "Vec_Int_t *Iso_ManFindMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      if ((vPerm2_ != (Vec_Int_t *)0x0) && (vPerm2_->nSize != pAig2->nObjs[2])) {
        __assert_fail("Vec_IntSize(vPerm2_) == Aig_ManCiNum(pAig2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                      ,0x123,
                      "Vec_Int_t *Iso_ManFindMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar1 = 0;
      p_00 = Vec_IntAlloc(0);
      vInvPerm2 = p_00;
      if ((long)p->nSize != 0) {
        iVar2 = *p->pArray;
        for (lVar6 = 1; lVar6 < p->nSize; lVar6 = lVar6 + 1) {
          iVar3 = p->pArray[lVar6];
          if (iVar2 <= iVar3) {
            iVar2 = iVar3;
          }
        }
        nCapMin = iVar2 + 1;
        Vec_IntGrow(p_00,nCapMin);
        uVar4 = 0;
        uVar5 = 0;
        if (0 < (int)nCapMin) {
          uVar5 = (ulong)nCapMin;
        }
        for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
          p_00->pArray[uVar4] = -1;
        }
        p_00->nSize = nCapMin;
        for (iVar2 = 0; iVar2 < p->nSize; iVar2 = iVar2 + 1) {
          iVar3 = Vec_IntEntry(p,iVar2);
          if (iVar3 != -1) {
            Vec_IntWriteEntry(p_00,iVar3,iVar2);
          }
        }
      }
      for (; iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
        iVar2 = Vec_IntEntry(p_00,iVar1);
        if ((iVar2 < 0) || (pAig1->nObjs[2] <= iVar2)) {
          __assert_fail("Entry >= 0 && Entry < Aig_ManCiNum(pAig1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                        ,0x129,
                        "Vec_Int_t *Iso_ManFindMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        iVar2 = Vec_IntEntry(local_50,iVar2);
        Vec_IntWriteEntry(p_00,iVar1,iVar2);
      }
      if (vPerm1_ == (Vec_Int_t *)0x0) {
        Vec_IntFree(local_50);
      }
      if (vPerm2_ == (Vec_Int_t *)0x0) {
        Vec_IntFree(p);
      }
      iVar1 = Iso_ManCheckMapping(pAig1,pAig2,p_00,fVerbose);
      if (iVar1 != 0) {
        return p_00;
      }
      Vec_IntFreeP(&vInvPerm2);
      return vInvPerm2;
    }
  }
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Iso_ManFindMapping( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vPerm1_, Vec_Int_t * vPerm2_, int fVerbose )
{
    Vec_Int_t * vPerm1, * vPerm2, * vInvPerm2;
    int i, Entry;
    if ( Aig_ManCiNum(pAig1) != Aig_ManCiNum(pAig2) )
        return NULL;
    if ( Aig_ManCoNum(pAig1) != Aig_ManCoNum(pAig2) )
        return NULL;
    if ( Aig_ManRegNum(pAig1) != Aig_ManRegNum(pAig2) )
        return NULL;
    if ( Aig_ManNodeNum(pAig1) != Aig_ManNodeNum(pAig2) )
        return NULL;
    if ( Aig_ManLevelNum(pAig1) != Aig_ManLevelNum(pAig2) )
        return NULL;
//    if ( Iso_ManNegEdgeNum(pAig1) != Iso_ManNegEdgeNum(pAig2) )
//        return NULL;
//    s_Counter++;

    if ( fVerbose ) 
        printf( "AIG1:\n" );
    vPerm1 = vPerm1_ ? vPerm1_ : Saig_ManFindIsoPerm( pAig1, fVerbose );
    if ( fVerbose )
        printf( "AIG1:\n" );
    vPerm2 = vPerm2_ ? vPerm2_ : Saig_ManFindIsoPerm( pAig2, fVerbose );
    if ( vPerm1_ )
        assert( Vec_IntSize(vPerm1_) == Aig_ManCiNum(pAig1) );
    if ( vPerm2_ )
        assert( Vec_IntSize(vPerm2_) == Aig_ManCiNum(pAig2) );
    // find canonical permutation
    // vPerm1/vPerm2 give canonical order of CIs of AIG1/AIG2
    vInvPerm2 = Vec_IntInvert( vPerm2, -1 );
    Vec_IntForEachEntry( vInvPerm2, Entry, i )
    {
        assert( Entry >= 0 && Entry < Aig_ManCiNum(pAig1) );
        Vec_IntWriteEntry( vInvPerm2, i, Vec_IntEntry(vPerm1, Entry) );
    }
    if ( vPerm1_ == NULL )
        Vec_IntFree( vPerm1 );
    if ( vPerm2_ == NULL )
        Vec_IntFree( vPerm2 );
    // check if they are indeed equivalent
    if ( !Iso_ManCheckMapping( pAig1, pAig2, vInvPerm2, fVerbose ) )
        Vec_IntFreeP( &vInvPerm2 );
    return vInvPerm2;
}